

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

int getVertexCopy(Vertex *vertex,btAlignedObjectArray<btConvexHullInternal::Vertex_*> *vertices)

{
  uint uVar1;
  Vertex **ppVVar2;
  ulong uVar3;
  int sz;
  uint uVar4;
  int iVar5;
  
  uVar4 = vertex->copy;
  if ((int)uVar4 < 0) {
    uVar4 = vertices->m_size;
    vertex->copy = uVar4;
    uVar1 = uVar4;
    if (uVar4 == vertices->m_capacity) {
      iVar5 = 1;
      if (uVar4 != 0) {
        iVar5 = uVar4 * 2;
      }
      if ((int)uVar4 < iVar5) {
        if (iVar5 == 0) {
          ppVVar2 = (Vertex **)0x0;
        }
        else {
          ppVVar2 = (Vertex **)btAlignedAllocInternal((long)iVar5 << 3,0x10);
          uVar1 = vertices->m_size;
        }
        if (0 < (int)uVar1) {
          uVar3 = 0;
          do {
            ppVVar2[uVar3] = vertices->m_data[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
        if ((vertices->m_data != (Vertex **)0x0) && (vertices->m_ownsMemory == true)) {
          btAlignedFreeInternal(vertices->m_data);
          uVar1 = vertices->m_size;
        }
        vertices->m_ownsMemory = true;
        vertices->m_data = ppVVar2;
        vertices->m_capacity = iVar5;
      }
    }
    vertices->m_data[(int)uVar1] = vertex;
    vertices->m_size = uVar1 + 1;
  }
  return uVar4;
}

Assistant:

static int getVertexCopy(btConvexHullInternal::Vertex* vertex, btAlignedObjectArray<btConvexHullInternal::Vertex*>& vertices)
{
	int index = vertex->copy;
	if (index < 0)
	{
		index = vertices.size();
		vertex->copy = index;
		vertices.push_back(vertex);
#ifdef DEBUG_CONVEX_HULL
		printf("Vertex %d gets index *%d\n", vertex->point.index, index);
#endif
	}
	return index;
}